

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O3

void Diligent::HashCombine<unsigned_int,Diligent::SamplerDesc>
               (size_t *Seed,uint *FirstArg,SamplerDesc *RestArgs)

{
  ulong uVar1;
  uint uVar2;
  HashCombiner<Diligent::DefaultHasher,_Diligent::SamplerDesc> Combiner;
  DefaultHasher Hasher;
  HashCombiner<Diligent::DefaultHasher,_Diligent::SamplerDesc> local_28;
  long local_20;
  
  uVar2 = (*FirstArg * 0x1001 >> 0x16 ^ *FirstArg * 0x1001) * 0x11;
  uVar2 = (uVar2 >> 9 ^ uVar2) * 0x401;
  uVar1 = *Seed;
  *Seed = (uVar1 >> 2) + uVar1 * 0x40 + 0x9e3779b9 + (ulong)((uVar2 >> 2 ^ uVar2) * 0x81081) ^ uVar1
  ;
  local_28.super_HashCombinerBase<Diligent::DefaultHasher>.m_Hasher =
       (HashCombinerBase<Diligent::DefaultHasher>)&local_20;
  local_20 = 0;
  HashCombiner<Diligent::DefaultHasher,_Diligent::SamplerDesc>::operator()(&local_28,RestArgs);
  uVar1 = *Seed;
  *Seed = (uVar1 >> 2) + 0x9e3779b9 + uVar1 * 0x40 + local_20 ^ uVar1;
  return;
}

Assistant:

void HashCombine(std::size_t& Seed, const FirstArgType& FirstArg, const RestArgsType&... RestArgs) noexcept
{
    HashCombine(Seed, FirstArg);
    HashCombine(Seed, RestArgs...); // recursive call using pack expansion syntax
}